

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.cpp
# Opt level: O1

void __thiscall
cfd::core::logger::CfdLogger::WriteLog
          (CfdLogger *this,CfdSourceLocation *location,CfdLogLevel level,string *log_message)

{
  if ((((this->is_initialized_ == true) && (this->is_alive_ == true)) &&
      (this->function_address_ == (void *)0x0)) && (this->default_logger_ != (void *)0x0)) {
    printf("[%s:%d](%d) %s: %s",location->filename,(ulong)(uint)location->line,level,
           location->funcname,(log_message->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void cfd::core::logger::CfdLogger::WriteLog(
    const CfdSourceLocation& location, cfd::core::logger::CfdLogLevel level,
    const std::string& log_message) {
  if (is_initialized_ && is_alive_) {
    if (function_address_ != nullptr) {
      // extend log
    } else if (default_logger_ != nullptr) {
#if defined(CFDCORE_LOGGING) && (defined(DEBUG) || defined(CFDCORE_DEBUG))
      auto logger = static_cast<quill::Logger*>(default_logger_);
      if (level == CfdLogLevel::kCfdLogLevelCritical) {
        LOG_CRITICAL(
            logger, "[{}:{}] {}", location.filename, location.line,
            log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelError) {
        LOG_ERROR(
            logger, "[{}:{}] {}", location.filename, location.line,
            log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelWarning) {
        LOG_WARNING(
            logger, "[{}:{}] {}", location.filename, location.line,
            log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelInfo) {
        LOG_INFO(
            logger, "[{}:{}] {}: {}", location.filename, location.line,
            location.funcname, log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelDebug) {
        LOG_DEBUG(
            logger, "[{}:{}] {}: {}", location.filename, location.line,
            location.funcname, log_message);
      } else if (level == CfdLogLevel::kCfdLogLevelTrace) {
        LOG_TRACE_L1(
            logger, "[{}:{}] {}: {}", location.filename, location.line,
            location.funcname, log_message);
      }
#else
      printf(
          "[%s:%d](%d) %s: %s", location.filename, location.line, level,
          location.funcname, log_message.c_str());
#endif  // CFDCORE_LOGGING
    }
  }
}